

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageT<float,_4U>::getUNORMPacked
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ImageT<float,_4U> *this,uint32_t c0,uint32_t c1,uint32_t c2,uint32_t c3)

{
  pointer puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint32_t uVar5;
  uint uVar6;
  undefined4 in_register_00000084;
  undefined4 in_register_0000008c;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  allocator_type local_41;
  undefined8 local_40;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_0000008c,c3);
  local_40 = CONCAT44(in_register_00000084,c2);
  uVar3 = c2 + c3 + c1 + c0;
  if ((uVar3 & 7) != 0) {
    __assert_fail("(c0 + c1 + c2 + c3) % 8 == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x347,
                  "virtual std::vector<uint8_t> ImageT<float, 4>::getUNORMPacked(uint32_t, uint32_t, uint32_t, uint32_t) const [componentType = float, componentCount = 4]"
                 );
  }
  uVar9 = uVar3 - 8 >> 3;
  if ((7 < uVar9) || ((0x8bU >> (uVar9 & 0x1f) & 1) == 0)) {
    __assert_fail("targetPackBytes == 1 || targetPackBytes == 2 || targetPackBytes == 4 || targetPackBytes == 8"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x349,
                  "virtual std::vector<uint8_t> ImageT<float, 4>::getUNORMPacked(uint32_t, uint32_t, uint32_t, uint32_t) const [componentType = float, componentCount = 4]"
                 );
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,
             (ulong)((this->super_Image).height * (uVar3 >> 3) * (this->super_Image).width),
             &local_41);
  uVar5 = (this->super_Image).height;
  if (uVar5 != 0) {
    uVar4 = (this->super_Image).width;
    uVar2 = 0;
    do {
      uVar6 = 0;
      if (uVar4 != 0) {
        uVar6 = 0;
        do {
          if (uVar9 < 8) {
            puVar1 = (__return_storage_ptr__->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar4 = (uVar4 * uVar2 + uVar6) * (uVar3 >> 3);
            uVar8 = (uint)local_40;
            uVar7 = (uint)local_38;
            switch(uVar9) {
            case 0:
              if ((((0x20 < c0) || (0x20 < c1)) || (0x20 < uVar8)) || (0x20 < uVar7)) {
LAB_0017ad63:
                __assert_fail("targetBits > 0 && targetBits <= 32",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                              ,0xef,"uint32_t imageio::convertUNORM(uint32_t, uint32_t, uint32_t)");
              }
              puVar1[uVar4] = '\0';
              break;
            case 1:
              if (((0x20 < c0) || (0x20 < c1)) || ((0x20 < uVar8 || (0x20 < uVar7))))
              goto LAB_0017ad63;
              (puVar1 + uVar4)[0] = '\0';
              (puVar1 + uVar4)[1] = '\0';
              break;
            case 3:
              if (((0x20 < c0) || (0x20 < c1)) || ((0x20 < uVar8 || (0x20 < uVar7))))
              goto LAB_0017ad63;
              puVar1 = puVar1 + uVar4;
              puVar1[0] = '\0';
              puVar1[1] = '\0';
              puVar1[2] = '\0';
              puVar1[3] = '\0';
              break;
            case 7:
              if ((((0x20 < c0) || (0x20 < c1)) || (0x20 < uVar8)) || (0x20 < uVar7))
              goto LAB_0017ad63;
              puVar1 = puVar1 + uVar4;
              puVar1[0] = '\0';
              puVar1[1] = '\0';
              puVar1[2] = '\0';
              puVar1[3] = '\0';
              puVar1[4] = '\0';
              puVar1[5] = '\0';
              puVar1[6] = '\0';
              puVar1[7] = '\0';
            }
          }
          uVar6 = uVar6 + 1;
          uVar4 = (this->super_Image).width;
        } while (uVar6 < uVar4);
        uVar5 = (this->super_Image).height;
        uVar6 = uVar4;
      }
      uVar4 = uVar6;
      uVar2 = uVar2 + 1;
    } while (uVar2 < uVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::vector<uint8_t> getUNORMPacked(
            uint32_t c0, uint32_t c1, uint32_t c2, uint32_t c3) const override {
        assert((c0 + c1 + c2 + c3) % 8 == 0);
        const auto targetPackBytes = (c0 + c1 + c2 + c3) / 8;
        assert(targetPackBytes == 1 || targetPackBytes == 2 || targetPackBytes == 4 || targetPackBytes == 8);
        const auto packC0 = c0 > 0;
        const auto packC1 = c1 > 0;
        const auto packC2 = c2 > 0;
        const auto packC3 = c3 > 0;
        const auto numChannels = (packC0 ? 1u : 0) + (packC1 ? 1u : 0) + (packC2 ? 1u : 0) + (packC3 ? 1u : 0);
        assert(numChannels <= componentCount); (void) numChannels;
        const uint32_t sourceBits = sizeof(componentType) * 8;
        static constexpr auto hasC0 = componentCount > 0;
        static constexpr auto hasC1 = componentCount > 1;
        static constexpr auto hasC2 = componentCount > 2;
        static constexpr auto hasC3 = componentCount > 3;

        std::vector<uint8_t> data(height * width * targetPackBytes);

        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                const auto& pixel = pixels[y * width + x];
                auto* target = data.data() + (y * width + x) * targetPackBytes;

                const auto copy = [&](auto& pack) {
                    using PackType = std::remove_reference_t<decltype(pack)>;

                    if (packC0) {
                        const auto sourceValue = hasC0 ? pixel[0] : componentType{0};
                        const auto value = imageio::convertUNORM(static_cast<uint32_t>(sourceValue), sourceBits, c0);
                        pack |= static_cast<PackType>(value) << (c1 + c2 + c3);
                    }
                    if (packC1) {
                        const auto sourceValue = hasC1 ? pixel[1] : componentType{0};
                        const auto value = imageio::convertUNORM(static_cast<uint32_t>(sourceValue), sourceBits, c1);
                        pack |= static_cast<PackType>(value) << (c2 + c3);
                    }
                    if (packC2) {
                        const auto sourceValue = hasC2 ? pixel[2] : componentType{0};
                        const auto value = imageio::convertUNORM(static_cast<uint32_t>(sourceValue), sourceBits, c2);
                        pack |= static_cast<PackType>(value) << c3;
                    }
                    if (packC3) {
                        const auto sourceValue = hasC3 ? pixel[3] : Color::one();
                        const auto value = imageio::convertUNORM(static_cast<uint32_t>(sourceValue), sourceBits, c3);
                        pack |= static_cast<PackType>(value);
                    }
                };

                if (targetPackBytes == 1) {
                    uint8_t pack = 0;
                    copy(pack);
                    std::memcpy(target, &pack, sizeof(pack));
                } else if (targetPackBytes == 2) {
                    uint16_t pack = 0;
                    copy(pack);
                    std::memcpy(target, &pack, sizeof(pack));
                } else if (targetPackBytes == 4) {
                    uint32_t pack = 0;
                    copy(pack);
                    std::memcpy(target, &pack, sizeof(pack));
                } else if (targetPackBytes == 8) {
                    uint64_t pack = 0;
                    copy(pack);
                    std::memcpy(target, &pack, sizeof(pack));
                }
            }
        }

        return data;
    }